

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memarena.cpp
# Opt level: O2

void __thiscall FSharedStringArena::FreeAll(FSharedStringArena *this)

{
  Block *pBVar1;
  Block *pBVar2;
  Block *pBVar3;
  Block *pBVar4;
  
  pBVar4 = (this->super_FMemArena).TopBlock;
  while (pBVar4 != (Block *)0x0) {
    pBVar1 = pBVar4->NextBlock;
    pBVar2 = (Block *)pBVar4->Avail;
    pBVar3 = pBVar4 + 0x18;
    pBVar4->Avail = pBVar3;
    for (; pBVar3 < pBVar2; pBVar3 = pBVar3 + 1) {
      FString::~FString((FString *)&pBVar3->Limit);
    }
    pBVar4->NextBlock = (this->super_FMemArena).FreeBlocks;
    (this->super_FMemArena).FreeBlocks = pBVar4;
    pBVar4 = pBVar1;
  }
  memset(this->Buckets,0,0x800);
  (this->super_FMemArena).TopBlock = (Block *)0x0;
  return;
}

Assistant:

void FSharedStringArena::FreeAll()
{
	for (Block *next, *block = TopBlock; block != NULL; block = next)
	{
		next = block->NextBlock;
		void *limit = block->Avail;
		block->Reset();
		for (Node *string = (Node *)block->Avail; string < limit; ++string)
		{
			string->~Node();
		}
		block->NextBlock = FreeBlocks;
		FreeBlocks = block;
	}
	memset(Buckets, 0, sizeof(Buckets));
	TopBlock = NULL;
}